

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksInDomain
          (Registry *this,string *aDomainName,NetworkArray *aRet)

{
  bool bVar1;
  __type _Var2;
  Status SVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  Domain curDom;
  Network curNwk;
  Network nwk;
  
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&nwk);
  _Var2 = std::operator==(aDomainName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
  if (_Var2) {
    Domain::Domain(&curDom);
    Network::Network(&curNwk);
    SVar3 = GetCurrentNetwork(this,&curNwk);
    if (SVar3 == kSuccess) {
      uVar6 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                        (this->mStorage,&curNwk.mDomainId,&curDom);
      SVar3 = (Status)uVar6;
      if (SVar3 != kSuccess) {
        if ((uVar6 & 0xff) != 1) {
          SVar3 = kError;
        }
        goto LAB_0018087c;
      }
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::push_back(&domains,&curDom);
      bVar1 = true;
      SVar3 = kSuccess;
    }
    else {
LAB_0018087c:
      bVar1 = false;
    }
    Network::~Network(&curNwk);
    std::__cxx11::string::~string((string *)&curDom.mName);
    if (!bVar1) goto LAB_00180941;
  }
  else {
    DomainId::DomainId(&curDom.mId,0xffffffff);
    Domain::Domain((Domain *)&curNwk,&curDom.mId,aDomainName);
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,&curNwk,&domains);
    cVar4 = (char)iVar5;
    SVar3 = (cVar4 != '\0') << 2;
    if (cVar4 == '\x01') {
      SVar3 = kNotFound;
    }
    std::__cxx11::string::~string((string *)&curNwk.mName);
    if (cVar4 != '\0') goto LAB_00180941;
  }
  SVar3 = kAmbiguity;
  if ((ulong)(((long)domains.
                     super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)domains.
                    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28) < 2) {
    nwk.mDomainId.mId =
         ((domains.
           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           ._M_impl.super__Vector_impl_data._M_start)->mId).mId;
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,&nwk,aRet);
    SVar3 = ((char)iVar5 != '\0') << 2;
    if ((char)iVar5 == '\x01') {
      SVar3 = kNotFound;
    }
  }
LAB_00180941:
  Network::~Network(&nwk);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&domains);
  return SVar3;
}

Assistant:

Registry::Status Registry::GetNetworksInDomain(const std::string &aDomainName, NetworkArray &aRet)
{
    Registry::Status    status;
    std::vector<Domain> domains;
    Network             nwk{};

    if (aDomainName == ALIAS_THIS)
    {
        Domain  curDom;
        Network curNwk;
        status = GetCurrentNetwork(curNwk);
        if (status == Registry::Status::kSuccess)
        {
            status = MapStatus(mStorage->Get(curNwk.mDomainId, curDom));
        }
        VerifyOrExit(status == Registry::Status::kSuccess);
        domains.push_back(curDom);
    }
    else
    {
        Domain dom{DomainId{EMPTY_ID}, aDomainName};
        VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, domains))) == Registry::Status::kSuccess);
    }
    VerifyOrExit(domains.size() < 2, status = Registry::Status::kAmbiguity);
    nwk.mDomainId = domains[0].mId;
    status        = MapStatus(mStorage->Lookup(nwk, aRet));
exit:
    return status;
}